

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O0

void __thiscall
Omega_h::HostWrite<double>::HostWrite
          (HostWrite<double> *this,LO size_in,double offset,double stride,string *name_in)

{
  Write<double> local_40;
  string *local_30;
  string *name_in_local;
  double stride_local;
  double offset_local;
  HostWrite<double> *pHStack_10;
  LO size_in_local;
  HostWrite<double> *this_local;
  
  local_30 = name_in;
  name_in_local = (string *)stride;
  stride_local = offset;
  offset_local._4_4_ = size_in;
  pHStack_10 = this;
  Write<double>::Write(&local_40,size_in,offset,stride,name_in);
  HostWrite(this,&local_40);
  Write<double>::~Write(&local_40);
  return;
}

Assistant:

HostWrite<T>::HostWrite(
    LO size_in, T offset, T stride, std::string const& name_in)
    : HostWrite<T>(Write<T>(size_in, offset, stride, name_in)) {}